

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinExport::WriteBinaryNodeAnim(AssbinExport *this,IOStream *container,aiNodeAnim *nd)

{
  uint local_6c;
  uint local_68 [4];
  undefined1 local_58 [8];
  AssbinChunkWriter chunk;
  aiNodeAnim *nd_local;
  IOStream *container_local;
  AssbinExport *this_local;
  
  chunk.initial = (size_t)nd;
  AssbinChunkWriter::AssbinChunkWriter((AssbinChunkWriter *)local_58,container,0x1238,0x1000);
  Write<aiString>((IOStream *)local_58,(aiString *)chunk.initial);
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x404));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x410));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x420));
  local_68[0] = *(uint *)(chunk.initial + 0x430);
  Write<unsigned_int>((IOStream *)local_58,local_68);
  local_6c = *(uint *)(chunk.initial + 0x434);
  Write<unsigned_int>((IOStream *)local_58,&local_6c);
  if (*(long *)(chunk.initial + 0x408) != 0) {
    if ((this->shortened & 1U) == 0) {
      WriteArray<aiVectorKey>
                ((IOStream *)local_58,*(aiVectorKey **)(chunk.initial + 0x408),
                 *(uint *)(chunk.initial + 0x404));
    }
    else {
      WriteBounds<aiVectorKey>
                ((IOStream *)local_58,*(aiVectorKey **)(chunk.initial + 0x408),
                 *(uint *)(chunk.initial + 0x404));
    }
  }
  if (*(long *)(chunk.initial + 0x418) != 0) {
    if ((this->shortened & 1U) == 0) {
      WriteArray<aiQuatKey>
                ((IOStream *)local_58,*(aiQuatKey **)(chunk.initial + 0x418),
                 *(uint *)(chunk.initial + 0x410));
    }
    else {
      WriteBounds<aiQuatKey>
                ((IOStream *)local_58,*(aiQuatKey **)(chunk.initial + 0x418),
                 *(uint *)(chunk.initial + 0x410));
    }
  }
  if (*(long *)(chunk.initial + 0x428) != 0) {
    if ((this->shortened & 1U) == 0) {
      WriteArray<aiVectorKey>
                ((IOStream *)local_58,*(aiVectorKey **)(chunk.initial + 0x428),
                 *(uint *)(chunk.initial + 0x420));
    }
    else {
      WriteBounds<aiVectorKey>
                ((IOStream *)local_58,*(aiVectorKey **)(chunk.initial + 0x428),
                 *(uint *)(chunk.initial + 0x420));
    }
  }
  AssbinChunkWriter::~AssbinChunkWriter((AssbinChunkWriter *)local_58);
  return;
}

Assistant:

void WriteBinaryNodeAnim(IOStream * container, const aiNodeAnim* nd)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AINODEANIM );

        Write<aiString>(&chunk,nd->mNodeName);
        Write<unsigned int>(&chunk,nd->mNumPositionKeys);
        Write<unsigned int>(&chunk,nd->mNumRotationKeys);
        Write<unsigned int>(&chunk,nd->mNumScalingKeys);
        Write<unsigned int>(&chunk,nd->mPreState);
        Write<unsigned int>(&chunk,nd->mPostState);

        if (nd->mPositionKeys) {
            if (shortened) {
                WriteBounds(&chunk,nd->mPositionKeys,nd->mNumPositionKeys);

            } // else write as usual
            else WriteArray<aiVectorKey>(&chunk,nd->mPositionKeys,nd->mNumPositionKeys);
        }
        if (nd->mRotationKeys) {
            if (shortened) {
                WriteBounds(&chunk,nd->mRotationKeys,nd->mNumRotationKeys);

            } // else write as usual
            else WriteArray<aiQuatKey>(&chunk,nd->mRotationKeys,nd->mNumRotationKeys);
        }
        if (nd->mScalingKeys) {
            if (shortened) {
                WriteBounds(&chunk,nd->mScalingKeys,nd->mNumScalingKeys);

            } // else write as usual
            else WriteArray<aiVectorKey>(&chunk,nd->mScalingKeys,nd->mNumScalingKeys);
        }
    }